

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall soplex::SLUFactor<double>::clear(SLUFactor<double> *this)

{
  int **p;
  int **p_00;
  int **p_01;
  int **p_02;
  int **p_03;
  pointer pdVar1;
  pointer pdVar2;
  int *piVar3;
  
  (this->super_CLUFactor<double>).rowMemMult = 5.0;
  (this->super_CLUFactor<double>).colMemMult = 5.0;
  (this->super_CLUFactor<double>).lMemMult = 1.0;
  (this->super_CLUFactor<double>).l.firstUpdate = 0;
  (this->super_CLUFactor<double>).l.firstUnused = 0;
  this->usetup = false;
  (this->super_CLUFactor<double>).initMaxabs = 1.0;
  (this->super_CLUFactor<double>).maxabs = 1.0;
  this->lastThreshold = this->minThreshold;
  this->minStability = 0.04;
  (this->super_CLUFactor<double>).stat = UNLOADED;
  (this->super_CLUFactor<double>).thedim = 0;
  pdVar1 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  SSVectorBase<double>::clear(&this->eta);
  SSVectorBase<double>::clear(&this->ssvec);
  SSVectorBase<double>::clear(&this->forest);
  (this->super_CLUFactor<double>).u.row.size = 100;
  (this->super_CLUFactor<double>).u.col.size = 100;
  (this->super_CLUFactor<double>).l.size = 100;
  (this->super_CLUFactor<double>).l.startSize = 100;
  piVar3 = (this->super_CLUFactor<double>).l.ridx;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (this->super_CLUFactor<double>).l.ridx = (int *)0x0;
  }
  piVar3 = (this->super_CLUFactor<double>).l.rbeg;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (this->super_CLUFactor<double>).l.rbeg = (int *)0x0;
  }
  piVar3 = (this->super_CLUFactor<double>).l.rorig;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (this->super_CLUFactor<double>).l.rorig = (int *)0x0;
  }
  piVar3 = (this->super_CLUFactor<double>).l.rperm;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (this->super_CLUFactor<double>).l.rperm = (int *)0x0;
  }
  pdVar1 = (this->super_CLUFactor<double>).u.row.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != *(pointer *)
                 ((long)&(this->super_CLUFactor<double>).u.row.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8)) {
    *(pointer *)
     ((long)&(this->super_CLUFactor<double>).u.row.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8
     ) = pdVar1;
  }
  p = &(this->super_CLUFactor<double>).u.row.idx;
  piVar3 = (this->super_CLUFactor<double>).u.row.idx;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    *p = (int *)0x0;
  }
  p_00 = &(this->super_CLUFactor<double>).u.col.idx;
  piVar3 = (this->super_CLUFactor<double>).u.col.idx;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    *p_00 = (int *)0x0;
  }
  p_01 = &(this->super_CLUFactor<double>).l.idx;
  piVar3 = (this->super_CLUFactor<double>).l.idx;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    *p_01 = (int *)0x0;
  }
  p_02 = &(this->super_CLUFactor<double>).l.start;
  piVar3 = (this->super_CLUFactor<double>).l.start;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    *p_02 = (int *)0x0;
  }
  p_03 = &(this->super_CLUFactor<double>).l.row;
  piVar3 = (this->super_CLUFactor<double>).l.row;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    *p_03 = (int *)0x0;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_CLUFactor<double>).u.row.val,
             (long)(this->super_CLUFactor<double>).u.row.size);
  spx_alloc<int*>(p,(this->super_CLUFactor<double>).u.row.size);
  spx_alloc<int*>(p_00,(this->super_CLUFactor<double>).u.col.size);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_CLUFactor<double>).l.val,(long)(this->super_CLUFactor<double>).l.size);
  spx_alloc<int*>(p_01,(this->super_CLUFactor<double>).l.size);
  spx_alloc<int*>(p_02,(this->super_CLUFactor<double>).l.startSize);
  spx_alloc<int*>(p_03,(this->super_CLUFactor<double>).l.startSize);
  return;
}

Assistant:

void SLUFactor<R>::clear()
{

   this->rowMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->colMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->lMemMult      = 1;          /* factor of minimum Memory * #of nonzeros */

   this->l.firstUpdate = 0;
   this->l.firstUnused = 0;
   this->thedim        = 0;

   usetup        = false;
   this->maxabs        = 1;
   this->initMaxabs    = 1;
   lastThreshold = minThreshold;
   minStability  = SOPLEX_MINSTABILITY;
   this->stat          = this->UNLOADED;

   vec.clear();
   eta.clear();
   ssvec.clear();
   forest.clear();

   this->u.row.size    = 100;
   this->u.col.size    = 100;
   this->l.size        = 100;
   this->l.startSize   = 100;

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);

   // G clear() is used in constructor of SLUFactor<R> so we have to
   // G clean up if anything goes wrong here
   try
   {
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx, this->u.row.size);
      spx_alloc(this->u.col.idx, this->u.col.size);

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx,   this->l.size);
      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }
}